

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O0

ssize_t __thiscall
LASreadItemCompressed_RGB14_v4::read
          (LASreadItemCompressed_RGB14_v4 *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  ushort uVar2;
  U32 UVar3;
  U32 UVar4;
  int iVar5;
  U16 *pUVar6;
  undefined4 in_register_00000034;
  byte local_10e;
  byte local_10d;
  uint local_108;
  byte local_102;
  byte local_101;
  byte local_fa;
  byte local_f9;
  uint local_f4;
  byte local_ee;
  byte local_ed;
  byte local_e6;
  byte local_e5;
  byte local_de;
  byte local_dd;
  uint local_d8;
  byte local_d2;
  byte local_d1;
  byte local_ca;
  byte local_c9;
  uint local_c4;
  byte local_be;
  byte local_bd;
  byte local_b6;
  byte local_b5;
  byte local_ae;
  byte local_ad;
  ushort local_a8;
  byte local_a2;
  byte local_a1;
  byte local_9a;
  byte local_99;
  ushort local_94;
  byte local_8e;
  byte local_8d;
  byte local_86;
  byte local_85;
  byte local_7e;
  byte local_7d;
  ushort local_78;
  byte local_72;
  byte local_71;
  byte local_6a;
  byte local_69;
  ushort local_64;
  byte local_5e;
  byte local_5d;
  byte local_56;
  byte local_55;
  uint local_50;
  uint local_4c;
  ushort local_48;
  ushort local_44;
  U32 sym;
  I32 diff;
  U8 corr;
  U16 *last_item;
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_RGB14_v4 *this_local;
  
  pUVar6 = (U16 *)CONCAT44(in_register_00000034,__fd);
  _diff = this->contexts[this->current_context].last_item;
  if (this->current_context != *__buf) {
    this->current_context = *__buf;
    if ((this->contexts[this->current_context].unused & 1U) != 0) {
      createAndInitModelsAndDecompressors(this,this->current_context,(U8 *)_diff);
    }
    _diff = this->contexts[this->current_context].last_item;
  }
  if ((this->changed_RGB & 1U) == 0) {
    *(undefined4 *)pUVar6 = *(undefined4 *)_diff;
    pUVar6[2] = _diff[2];
  }
  else {
    UVar3 = ArithmeticDecoder::decodeSymbol
                      (this->dec_RGB,this->contexts[this->current_context].m_byte_used);
    if ((UVar3 & 1) == 0) {
      *pUVar6 = *_diff & 0xff;
    }
    else {
      UVar4 = ArithmeticDecoder::decodeSymbol
                        (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_0);
      uVar2 = (ushort)UVar4;
      if ((int)((UVar4 & 0xff) + (*_diff & 0xff)) < 0) {
        local_44 = (uVar2 & 0xff) + (*_diff & 0xff) + 0x100;
      }
      else {
        if ((ushort)((ushort)(byte)UVar4 + (*_diff & 0xff)) < 0x100) {
          local_48 = (uVar2 & 0xff) + (*_diff & 0xff);
        }
        else {
          local_48 = ((uVar2 & 0xff) + (*_diff & 0xff)) - 0x100;
        }
        local_44 = local_48;
      }
      *pUVar6 = local_44;
    }
    if ((UVar3 & 2) == 0) {
      *pUVar6 = *pUVar6 | *_diff & 0xff00;
    }
    else {
      UVar4 = ArithmeticDecoder::decodeSymbol
                        (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_1);
      if ((int)((UVar4 & 0xff) + ((int)(uint)*_diff >> 8)) < 0) {
        local_4c = (UVar4 & 0xff) + ((int)(uint)*_diff >> 8) + 0x100;
      }
      else {
        if ((UVar4 & 0xff) + ((int)(uint)*_diff >> 8) < 0x100) {
          local_50 = (UVar4 & 0xff) + ((int)(uint)*_diff >> 8);
        }
        else {
          local_50 = ((UVar4 & 0xff) + ((int)(uint)*_diff >> 8)) - 0x100;
        }
        local_4c = local_50;
      }
      *pUVar6 = *pUVar6 | (ushort)((local_4c & 0xffff) << 8);
    }
    if ((UVar3 & 0x40) == 0) {
      pUVar6[1] = *pUVar6;
      pUVar6[2] = *pUVar6;
    }
    else {
      iVar5 = (*pUVar6 & 0xff) - (*_diff & 0xff);
      if ((UVar3 & 4) == 0) {
        pUVar6[1] = _diff[1] & 0xff;
      }
      else {
        UVar4 = ArithmeticDecoder::decodeSymbol
                          (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_2);
        cVar1 = (char)iVar5;
        if ((int)(iVar5 + (_diff[1] & 0xff)) < 1) {
          local_55 = 0;
        }
        else {
          if ((int)(iVar5 + (_diff[1] & 0xff)) < 0xff) {
            local_56 = cVar1 + (char)_diff[1];
          }
          else {
            local_56 = 0xff;
          }
          local_55 = local_56;
        }
        uVar2 = (ushort)UVar4;
        if ((int)((UVar4 & 0xff) + (uint)local_55) < 0) {
          if ((int)(iVar5 + (_diff[1] & 0xff)) < 1) {
            local_5d = 0;
          }
          else {
            if ((int)(iVar5 + (_diff[1] & 0xff)) < 0xff) {
              local_5e = cVar1 + (char)_diff[1];
            }
            else {
              local_5e = 0xff;
            }
            local_5d = local_5e;
          }
          local_64 = (uVar2 & 0xff) + (ushort)local_5d + 0x100;
        }
        else {
          if ((int)(iVar5 + (_diff[1] & 0xff)) < 1) {
            local_69 = 0;
          }
          else {
            if ((int)(iVar5 + (_diff[1] & 0xff)) < 0xff) {
              local_6a = cVar1 + (char)_diff[1];
            }
            else {
              local_6a = 0xff;
            }
            local_69 = local_6a;
          }
          if ((UVar4 & 0xff) + (uint)local_69 < 0x100) {
            if ((int)(iVar5 + (_diff[1] & 0xff)) < 1) {
              local_7d = 0;
            }
            else {
              if ((int)(iVar5 + (_diff[1] & 0xff)) < 0xff) {
                local_7e = cVar1 + (char)_diff[1];
              }
              else {
                local_7e = 0xff;
              }
              local_7d = local_7e;
            }
            local_78 = (uVar2 & 0xff) + (ushort)local_7d;
          }
          else {
            if ((int)(iVar5 + (_diff[1] & 0xff)) < 1) {
              local_71 = 0;
            }
            else {
              if ((int)(iVar5 + (_diff[1] & 0xff)) < 0xff) {
                local_72 = cVar1 + (char)_diff[1];
              }
              else {
                local_72 = 0xff;
              }
              local_71 = local_72;
            }
            local_78 = ((uVar2 & 0xff) + (ushort)local_71) - 0x100;
          }
          local_64 = local_78;
        }
        pUVar6[1] = local_64;
      }
      if ((UVar3 & 0x10) == 0) {
        pUVar6[2] = _diff[2] & 0xff;
      }
      else {
        UVar4 = ArithmeticDecoder::decodeSymbol
                          (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_4);
        iVar5 = (int)(iVar5 + ((pUVar6[1] & 0xff) - (_diff[1] & 0xff))) / 2;
        cVar1 = (char)iVar5;
        if ((int)(iVar5 + (_diff[2] & 0xff)) < 1) {
          local_85 = 0;
        }
        else {
          if ((int)(iVar5 + (_diff[2] & 0xff)) < 0xff) {
            local_86 = cVar1 + (char)_diff[2];
          }
          else {
            local_86 = 0xff;
          }
          local_85 = local_86;
        }
        uVar2 = (ushort)UVar4;
        if ((int)((UVar4 & 0xff) + (uint)local_85) < 0) {
          if ((int)(iVar5 + (_diff[2] & 0xff)) < 1) {
            local_8d = 0;
          }
          else {
            if ((int)(iVar5 + (_diff[2] & 0xff)) < 0xff) {
              local_8e = cVar1 + (char)_diff[2];
            }
            else {
              local_8e = 0xff;
            }
            local_8d = local_8e;
          }
          local_94 = (uVar2 & 0xff) + (ushort)local_8d + 0x100;
        }
        else {
          if ((int)(iVar5 + (_diff[2] & 0xff)) < 1) {
            local_99 = 0;
          }
          else {
            if ((int)(iVar5 + (_diff[2] & 0xff)) < 0xff) {
              local_9a = cVar1 + (char)_diff[2];
            }
            else {
              local_9a = 0xff;
            }
            local_99 = local_9a;
          }
          if ((UVar4 & 0xff) + (uint)local_99 < 0x100) {
            if ((int)(iVar5 + (_diff[2] & 0xff)) < 1) {
              local_ad = 0;
            }
            else {
              if ((int)(iVar5 + (_diff[2] & 0xff)) < 0xff) {
                local_ae = cVar1 + (char)_diff[2];
              }
              else {
                local_ae = 0xff;
              }
              local_ad = local_ae;
            }
            local_a8 = (uVar2 & 0xff) + (ushort)local_ad;
          }
          else {
            if ((int)(iVar5 + (_diff[2] & 0xff)) < 1) {
              local_a1 = 0;
            }
            else {
              if ((int)(iVar5 + (_diff[2] & 0xff)) < 0xff) {
                local_a2 = cVar1 + (char)_diff[2];
              }
              else {
                local_a2 = 0xff;
              }
              local_a1 = local_a2;
            }
            local_a8 = ((uVar2 & 0xff) + (ushort)local_a1) - 0x100;
          }
          local_94 = local_a8;
        }
        pUVar6[2] = local_94;
      }
      iVar5 = ((int)(uint)*pUVar6 >> 8) - ((int)(uint)*_diff >> 8);
      if ((UVar3 & 8) == 0) {
        pUVar6[1] = pUVar6[1] | _diff[1] & 0xff00;
      }
      else {
        UVar4 = ArithmeticDecoder::decodeSymbol
                          (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_3);
        cVar1 = (char)iVar5;
        if (iVar5 + ((int)(uint)_diff[1] >> 8) < 1) {
          local_b5 = 0;
        }
        else {
          if (iVar5 + ((int)(uint)_diff[1] >> 8) < 0xff) {
            local_b6 = cVar1 + (char)(_diff[1] >> 8);
          }
          else {
            local_b6 = 0xff;
          }
          local_b5 = local_b6;
        }
        if ((int)((UVar4 & 0xff) + (uint)local_b5) < 0) {
          if (iVar5 + ((int)(uint)_diff[1] >> 8) < 1) {
            local_bd = 0;
          }
          else {
            if (iVar5 + ((int)(uint)_diff[1] >> 8) < 0xff) {
              local_be = cVar1 + (char)(_diff[1] >> 8);
            }
            else {
              local_be = 0xff;
            }
            local_bd = local_be;
          }
          local_c4 = (UVar4 & 0xff) + (uint)local_bd + 0x100;
        }
        else {
          if (iVar5 + ((int)(uint)_diff[1] >> 8) < 1) {
            local_c9 = 0;
          }
          else {
            if (iVar5 + ((int)(uint)_diff[1] >> 8) < 0xff) {
              local_ca = cVar1 + (char)(_diff[1] >> 8);
            }
            else {
              local_ca = 0xff;
            }
            local_c9 = local_ca;
          }
          if ((UVar4 & 0xff) + (uint)local_c9 < 0x100) {
            if (iVar5 + ((int)(uint)_diff[1] >> 8) < 1) {
              local_dd = 0;
            }
            else {
              if (iVar5 + ((int)(uint)_diff[1] >> 8) < 0xff) {
                local_de = cVar1 + (char)(_diff[1] >> 8);
              }
              else {
                local_de = 0xff;
              }
              local_dd = local_de;
            }
            local_d8 = (UVar4 & 0xff) + (uint)local_dd;
          }
          else {
            if (iVar5 + ((int)(uint)_diff[1] >> 8) < 1) {
              local_d1 = 0;
            }
            else {
              if (iVar5 + ((int)(uint)_diff[1] >> 8) < 0xff) {
                local_d2 = cVar1 + (char)(_diff[1] >> 8);
              }
              else {
                local_d2 = 0xff;
              }
              local_d1 = local_d2;
            }
            local_d8 = ((UVar4 & 0xff) + (uint)local_d1) - 0x100;
          }
          local_c4 = local_d8;
        }
        pUVar6[1] = pUVar6[1] | (ushort)((local_c4 & 0xffff) << 8);
      }
      if ((UVar3 & 0x20) == 0) {
        pUVar6[2] = pUVar6[2] | _diff[2] & 0xff00;
      }
      else {
        UVar3 = ArithmeticDecoder::decodeSymbol
                          (this->dec_RGB,this->contexts[this->current_context].m_rgb_diff_5);
        iVar5 = (iVar5 + (((int)(uint)pUVar6[1] >> 8) - ((int)(uint)_diff[1] >> 8))) / 2;
        cVar1 = (char)iVar5;
        if (iVar5 + ((int)(uint)_diff[2] >> 8) < 1) {
          local_e5 = 0;
        }
        else {
          if (iVar5 + ((int)(uint)_diff[2] >> 8) < 0xff) {
            local_e6 = cVar1 + (char)(_diff[2] >> 8);
          }
          else {
            local_e6 = 0xff;
          }
          local_e5 = local_e6;
        }
        if ((int)((UVar3 & 0xff) + (uint)local_e5) < 0) {
          if (iVar5 + ((int)(uint)_diff[2] >> 8) < 1) {
            local_ed = 0;
          }
          else {
            if (iVar5 + ((int)(uint)_diff[2] >> 8) < 0xff) {
              local_ee = cVar1 + (char)(_diff[2] >> 8);
            }
            else {
              local_ee = 0xff;
            }
            local_ed = local_ee;
          }
          local_f4 = (UVar3 & 0xff) + (uint)local_ed + 0x100;
        }
        else {
          if (iVar5 + ((int)(uint)_diff[2] >> 8) < 1) {
            local_f9 = 0;
          }
          else {
            if (iVar5 + ((int)(uint)_diff[2] >> 8) < 0xff) {
              local_fa = cVar1 + (char)(_diff[2] >> 8);
            }
            else {
              local_fa = 0xff;
            }
            local_f9 = local_fa;
          }
          if ((UVar3 & 0xff) + (uint)local_f9 < 0x100) {
            if (iVar5 + ((int)(uint)_diff[2] >> 8) < 1) {
              local_10d = 0;
            }
            else {
              if (iVar5 + ((int)(uint)_diff[2] >> 8) < 0xff) {
                local_10e = cVar1 + (char)(_diff[2] >> 8);
              }
              else {
                local_10e = 0xff;
              }
              local_10d = local_10e;
            }
            local_108 = (UVar3 & 0xff) + (uint)local_10d;
          }
          else {
            if (iVar5 + ((int)(uint)_diff[2] >> 8) < 1) {
              local_101 = 0;
            }
            else {
              if (iVar5 + ((int)(uint)_diff[2] >> 8) < 0xff) {
                local_102 = cVar1 + (char)(_diff[2] >> 8);
              }
              else {
                local_102 = 0xff;
              }
              local_101 = local_102;
            }
            local_108 = ((UVar3 & 0xff) + (uint)local_101) - 0x100;
          }
          local_f4 = local_108;
        }
        pUVar6[2] = pUVar6[2] | (ushort)((local_f4 & 0xffff) << 8);
      }
    }
    *(undefined4 *)_diff = *(undefined4 *)pUVar6;
    _diff[2] = pUVar6[2];
    pUVar6 = _diff;
  }
  return (ssize_t)pUVar6;
}

Assistant:

inline void LASreadItemCompressed_RGB14_v4::read(U8* item, U32& context)
{
  // get last

  U16* last_item = contexts[current_context].last_item;

  // check for context switch

  if (current_context != context)
  {
    current_context = context; // all other items use context set by POINT14 reader
    if (contexts[current_context].unused)
    {
      createAndInitModelsAndDecompressors(current_context, (U8*)last_item);
    }
    last_item = contexts[current_context].last_item;
  }

  // decompress

  if (changed_RGB)
  {
    U8 corr;
    I32 diff = 0;
    U32 sym = dec_RGB->decodeSymbol(contexts[current_context].m_byte_used);
    if (sym & (1 << 0))
    {
      corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_0);
      ((U16*)item)[0] = (U16)U8_FOLD(corr + (last_item[0]&255));
    }
    else 
    {
      ((U16*)item)[0] = last_item[0]&0xFF;
    }
    if (sym & (1 << 1))
    {
      corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_1);
      ((U16*)item)[0] |= (((U16)U8_FOLD(corr + (last_item[0]>>8))) << 8);
    }
    else
    {
      ((U16*)item)[0] |= (last_item[0]&0xFF00);
    }
    if (sym & (1 << 6))
    {
      diff = (((U16*)item)[0]&0x00FF) - (last_item[0]&0x00FF);
      if (sym & (1 << 2))
      {
        corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_2);
        ((U16*)item)[1] = (U16)U8_FOLD(corr + U8_CLAMP(diff+(last_item[1]&255)));
      }
      else
      {
        ((U16*)item)[1] = last_item[1]&0xFF;
      }
      if (sym & (1 << 4))
      {
        corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_4);
        diff = (diff + ((((U16*)item)[1]&0x00FF) - (last_item[1]&0x00FF))) / 2;
        ((U16*)item)[2] = (U16)U8_FOLD(corr + U8_CLAMP(diff+(last_item[2]&255)));
      }
      else
      {
        ((U16*)item)[2] = last_item[2]&0xFF;
      }
      diff = (((U16*)item)[0]>>8) - (last_item[0]>>8);
      if (sym & (1 << 3))
      {
        corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_3);
        ((U16*)item)[1] |= (((U16)U8_FOLD(corr + U8_CLAMP(diff+(last_item[1]>>8))))<<8);
      }
      else
      {
        ((U16*)item)[1] |= (last_item[1]&0xFF00);
      }
      if (sym & (1 << 5))
      {
        corr = dec_RGB->decodeSymbol(contexts[current_context].m_rgb_diff_5);
        diff = (diff + ((((U16*)item)[1]>>8) - (last_item[1]>>8))) / 2;
        ((U16*)item)[2] |= (((U16)U8_FOLD(corr + U8_CLAMP(diff+(last_item[2]>>8))))<<8);
      }
      else
      {
        ((U16*)item)[2] |= (last_item[2]&0xFF00);
      }
    }
    else
    {
      ((U16*)item)[1] = ((U16*)item)[0];
      ((U16*)item)[2] = ((U16*)item)[0];
    }
    memcpy(last_item, item, 6);
  }
  else
  {
    memcpy(item, last_item, 6);
  }
}